

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_function_wrapper.cpp
# Opt level: O0

void __thiscall cpp_bindgen::anon_unknown_0::wrap_lambda2_Test::TestBody(wrap_lambda2_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_88;
  Message local_80;
  result_converted_to_c_t<int> local_78;
  int local_74;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  Message local_48;
  result_converted_to_c_t<int> local_40;
  int local_3c;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  wrapped_f<int_(),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_wdeconinck[P]cpp_bindgen_tests_unit_tests_test_function_wrapper_cpp:122:39)>
  local_20;
  wrapped_f<int_(),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_wdeconinck[P]cpp_bindgen_tests_unit_tests_test_function_wrapper_cpp:122:39)>
  testee;
  int val;
  wrap_lambda2_Test *this_local;
  
  testee.m_fun.val._4_4_ = 0x2a;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&testee.m_fun.val + 4);
  local_20 = wrap<int(),cpp_bindgen::(anonymous_namespace)::wrap_lambda2_Test::TestBody()::__0>
                       ((anon_class_8_1_ba1d8281_for_m_fun *)&gtest_ar.message_);
  local_3c = 0x2a;
  local_40 = _impl::
             wrapped_f<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/wdeconinck[P]cpp_bindgen/tests/unit_tests/test_function_wrapper.cpp:122:39)>
             ::operator()(&local_20);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_38,"42","testee()",&local_3c,&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wdeconinck[P]cpp_bindgen/tests/unit_tests/test_function_wrapper.cpp"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  testee.m_fun.val._4_4_ = 1;
  local_74 = 1;
  local_78 = _impl::
             wrapped_f<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/wdeconinck[P]cpp_bindgen/tests/unit_tests/test_function_wrapper.cpp:122:39)>
             ::operator()(&local_20);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_70,"1","testee()",&local_74,&local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wdeconinck[P]cpp_bindgen/tests/unit_tests/test_function_wrapper.cpp"
               ,0x7d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  return;
}

Assistant:

TEST(wrap, lambda2) {
            int val = 42;
            auto testee = wrap<int()>([&] { return val; });
            EXPECT_EQ(42, testee());
            val = 1;
            EXPECT_EQ(1, testee());
        }